

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void put_short_code(DynBuf *bc_out,int op,int idx)

{
  char cVar1;
  uint8_t c;
  
  if (idx < 4) {
    cVar1 = (char)idx;
    switch(op) {
    case 0x58:
      idx = (int)(byte)(cVar1 - 0x3d);
      break;
    case 0x59:
      idx = (int)(byte)(cVar1 - 0x39);
      break;
    case 0x5a:
      idx = (int)(byte)(cVar1 - 0x35);
      break;
    case 0x5b:
      idx = (int)(byte)(cVar1 - 0x31);
      break;
    case 0x5c:
      idx = (int)(byte)(cVar1 - 0x2d);
      break;
    case 0x5d:
      idx = (int)(byte)(cVar1 - 0x29);
      break;
    case 0x5e:
      idx = (int)(byte)(cVar1 - 0x25);
      break;
    case 0x5f:
      idx = (int)(byte)(cVar1 - 0x21);
      break;
    case 0x60:
      idx = (int)(byte)(cVar1 - 0x1d);
      break;
    default:
      if (op != 0x22) goto LAB_00150e39;
      idx = (int)(byte)(cVar1 - 0x14);
    }
  }
  else {
    if (0xff < (uint)idx) {
LAB_00150e39:
      dbuf_putc(bc_out,(uint8_t)op);
      dbuf_put_u16(bc_out,(uint16_t)idx);
      return;
    }
    if (op == 0x5a) {
      c = 0xc2;
    }
    else if (op == 0x59) {
      c = 0xc1;
    }
    else {
      if (op != 0x58) goto LAB_00150e39;
      c = 0xc0;
    }
    dbuf_putc(bc_out,c);
  }
  dbuf_putc(bc_out,(uint8_t)idx);
  return;
}

Assistant:

static void put_short_code(DynBuf *bc_out, int op, int idx)
{
#if SHORT_OPCODES
    if (idx < 4) {
        switch (op) {
        case OP_get_loc:
            dbuf_putc(bc_out, OP_get_loc0 + idx);
            return;
        case OP_put_loc:
            dbuf_putc(bc_out, OP_put_loc0 + idx);
            return;
        case OP_set_loc:
            dbuf_putc(bc_out, OP_set_loc0 + idx);
            return;
        case OP_get_arg:
            dbuf_putc(bc_out, OP_get_arg0 + idx);
            return;
        case OP_put_arg:
            dbuf_putc(bc_out, OP_put_arg0 + idx);
            return;
        case OP_set_arg:
            dbuf_putc(bc_out, OP_set_arg0 + idx);
            return;
        case OP_get_var_ref:
            dbuf_putc(bc_out, OP_get_var_ref0 + idx);
            return;
        case OP_put_var_ref:
            dbuf_putc(bc_out, OP_put_var_ref0 + idx);
            return;
        case OP_set_var_ref:
            dbuf_putc(bc_out, OP_set_var_ref0 + idx);
            return;
        case OP_call:
            dbuf_putc(bc_out, OP_call0 + idx);
            return;
        }
    }
    if (idx < 256) {
        switch (op) {
        case OP_get_loc:
            dbuf_putc(bc_out, OP_get_loc8);
            dbuf_putc(bc_out, idx);
            return;
        case OP_put_loc:
            dbuf_putc(bc_out, OP_put_loc8);
            dbuf_putc(bc_out, idx);
            return;
        case OP_set_loc:
            dbuf_putc(bc_out, OP_set_loc8);
            dbuf_putc(bc_out, idx);
            return;
        }
    }
#endif
    dbuf_putc(bc_out, op);
    dbuf_put_u16(bc_out, idx);
}